

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGAttributeMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlAttrPtr prop)

{
  xmlStructuredErrorFunc str1;
  xmlRelaxNGDefinePtr pxVar1;
  int *piVar2;
  xmlGenericErrorFunc p_Var3;
  int iVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlAttrPtr extraout_RDX;
  xmlAttrPtr extraout_RDX_00;
  xmlAttrPtr extraout_RDX_01;
  xmlAttrPtr extraout_RDX_02;
  xmlRelaxNGValidCtxtPtr pxVar7;
  
  if ((ctxt->warning == (xmlRelaxNGValidityWarningFunc)0x0) ||
     (iVar4 = xmlStrEqual((xmlChar *)ctxt->warning,define->name), prop = extraout_RDX, iVar4 != 0))
  {
    str1 = ctxt->serror;
    if (str1 != (xmlStructuredErrorFunc)0x0) {
      pxVar1 = define->attrs;
      if (*str1 == (_func_void_void_ptr_xmlErrorPtr)0x0) {
        if (pxVar1 != (xmlRelaxNGDefinePtr)0x0) {
          return 0;
        }
      }
      else {
        if (pxVar1 == (xmlRelaxNGDefinePtr)0x0) {
          return 0;
        }
        iVar4 = xmlStrEqual((xmlChar *)str1,pxVar1->name);
        prop = extraout_RDX_00;
        if (iVar4 == 0) {
          return 0;
        }
      }
    }
    piVar2 = *(int **)&ctxt->errNr;
    if (piVar2 == (int *)0x0) {
      return 1;
    }
    if (*piVar2 == 0x11) {
      for (pxVar7 = *(xmlRelaxNGValidCtxtPtr *)(piVar2 + 0x14);
          pxVar7 != (xmlRelaxNGValidCtxtPtr)0x0; pxVar7 = *(xmlRelaxNGValidCtxtPtr *)&pxVar7->idref)
      {
        iVar4 = xmlRelaxNGAttributeMatch(pxVar7,define,prop);
        if (iVar4 == 1) {
          return 1;
        }
        prop = extraout_RDX_02;
      }
    }
    else {
      if (*piVar2 != 2) {
        pp_Var5 = __xmlGenericError();
        p_Var3 = *pp_Var5;
        ppvVar6 = __xmlGenericErrorContext();
        (*p_Var3)(*ppvVar6,"Unimplemented block at %s:%d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/relaxng.c"
                  ,0x2392);
        return 1;
      }
      pxVar7 = *(xmlRelaxNGValidCtxtPtr *)(piVar2 + 0xc);
      while( true ) {
        if (pxVar7 == (xmlRelaxNGValidCtxtPtr)0x0) {
          return 1;
        }
        iVar4 = xmlRelaxNGAttributeMatch(pxVar7,define,prop);
        if (iVar4 == 1) break;
        pxVar7 = *(xmlRelaxNGValidCtxtPtr *)&pxVar7->idref;
        prop = extraout_RDX_01;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlRelaxNGAttributeMatch(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGDefinePtr define, xmlAttrPtr prop)
{
    int ret;

    if (define->name != NULL) {
        if (!xmlStrEqual(define->name, prop->name))
            return (0);
    }
    if (define->ns != NULL) {
        if (define->ns[0] == 0) {
            if (prop->ns != NULL)
                return (0);
        } else {
            if ((prop->ns == NULL) ||
                (!xmlStrEqual(define->ns, prop->ns->href)))
                return (0);
        }
    }
    if (define->nameClass == NULL)
        return (1);
    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGAttributeMatch(ctxt, list, prop);
            if (ret == 1)
                return (0);
            if (ret < 0)
                return (ret);
            list = list->next;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGAttributeMatch(ctxt, list, prop);
            if (ret == 1)
                return (1);
            if (ret < 0)
                return (ret);
            list = list->next;
        }
        return (0);
    } else {
    TODO}
    return (1);
}